

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_Sum(SumForm1 Sum)

{
  byte value;
  uint32_t uVar1;
  Image input;
  Image local_78;
  ImageTemplate<unsigned_char> local_50;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_50,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_78,value,0,0,&local_50);
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  uVar1 = (*Sum)(&local_78);
  local_78._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_78);
  return uVar1 == local_78._width * value * local_78._height;
}

Assistant:

bool form1_Sum(SumForm1 Sum)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        return Sum( input ) == intensity * input.width() * input.height();
    }